

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Stack::dump(Stack *this)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  lVar2 = 0x10;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->stack).
                             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->stack).
                            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 400); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"stack[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"] = ");
    internal::operator<<
              (poVar1,(LocationRange *)
                      ((long)&((this->stack).
                               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                               ._M_impl.super__Vector_impl_data._M_start)->kind + lVar2));
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)((long)(this->stack).
                                              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar2 + -0x10));
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 400;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

virtual void dump(void)
    {
        for (std::size_t i = 0; i < stack.size(); ++i) {
            std::cout << "stack[" << i << "] = " << stack[i].location << " (" << stack[i].kind
                      << ")" << std::endl;
        }
        std::cout << std::endl;
    }